

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_9d1d6::GraphEdgeClipper::Run(GraphEdgeClipper *this)

{
  pointer *ppiVar1;
  _Bit_pointer *this_00;
  pointer *this_01;
  vector<int,_std::allocator<int>_> *pvVar2;
  Graph *pGVar3;
  vector<signed_char,_std::allocator<signed_char>_> *this_02;
  bool bVar4;
  byte bVar5;
  InputEdgeId IVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  const_reference pvVar10;
  pointer ppVar11;
  Edge *pEVar12;
  ostream *poVar13;
  reference piVar14;
  reference pvVar15;
  reference b;
  const_reference pvVar16;
  _Bit_reference *__x;
  reference pvVar17;
  reference rVar18;
  bool local_3d1;
  uint local_3ac;
  int local_35c;
  Edge local_1f0;
  reference local_1e8;
  int local_1d8;
  byte local_1d1;
  int ai_1;
  S2LogMessageVoidify local_1bd;
  Edge local_1bc;
  uint local_1b4;
  Edge EStack_1b0;
  int i_2;
  int local_1a8;
  uint local_1a4;
  int i_1;
  int edge_count;
  _Bit_type local_198;
  reference local_190;
  int local_180;
  uint local_17c;
  int ai;
  int multiplicity;
  reference local_168;
  int local_158;
  undefined1 local_151;
  int sign;
  bool is_line;
  Edge *e;
  CrossingGraphEdge *x;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int a_index;
  int iStack_11c;
  bool left_to_right;
  int bi;
  VertexId id;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  S2LogMessage local_e8;
  S2LogMessageVoidify local_d1;
  __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
  local_d0 [3];
  Edge *local_b8;
  Edge *edge0;
  InputEdgeId a_input_id;
  int i;
  const_iterator next;
  undefined1 local_98 [5];
  bool reverse_a;
  bool invert_b;
  bool inside;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  b_edges;
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  b_input_edges;
  vector<bool,_std::allocator<bool>_> a_isolated;
  vector<int,_std::allocator<int>_> a_num_crossings;
  vector<int,_std::allocator<int>_> a_vertices;
  GraphEdgeClipper *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  ::vector((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            *)&b_edges.
               super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  ::vector((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
            *)local_98);
  next._M_current._7_1_ = 0;
  next._M_current._6_1_ = 0;
  next._M_current._5_1_ = 0;
  _a_input_id = std::
                vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                ::begin(this->input_crossings_);
  edge0._4_4_ = 0;
  do {
    uVar7 = (ulong)edge0._4_4_;
    sVar8 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
    if (sVar8 <= uVar7) {
      std::
      vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
      ::~vector((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                 *)local_98);
      std::
      vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
      ::~vector((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                 *)&b_edges.
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)
                 &b_input_edges.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar2 = this->input_ids_;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->order_,(long)edge0._4_4_);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)*pvVar9);
    edge0._0_4_ = *pvVar10;
    pGVar3 = this->g_;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->order_,(long)edge0._4_4_);
    local_b8 = S2Builder::Graph::edge(pGVar3,*pvVar9);
    std::
    vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
    ::clear((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
             *)&b_edges.
                super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_d0[0]._M_current =
           (pair<int,_(anonymous_namespace)::CrossingInputEdge> *)
           std::
           vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           ::end(this->input_crossings_);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                          *)&a_input_id,local_d0);
      if (!bVar4) break;
      ppVar11 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                              *)&a_input_id);
      if (ppVar11->first != (value_type)edge0) break;
      ppVar11 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                              *)&a_input_id);
      IVar6 = CrossingInputEdge::input_id(&ppVar11->second);
      if (IVar6 < 0) {
        ppVar11 = __gnu_cxx::
                  __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                  ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                *)&a_input_id);
        IVar6 = CrossingInputEdge::input_id(&ppVar11->second);
        if (IVar6 == -1) {
          ppVar11 = __gnu_cxx::
                    __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                    ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                  *)&a_input_id);
          next._M_current._7_1_ = CrossingInputEdge::left_to_right(&ppVar11->second);
        }
        else {
          ppVar11 = __gnu_cxx::
                    __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                    ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                  *)&a_input_id);
          IVar6 = CrossingInputEdge::input_id(&ppVar11->second);
          if (IVar6 == -2) {
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                      ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                    *)&a_input_id);
            next._M_current._6_1_ = CrossingInputEdge::left_to_right(&ppVar11->second);
          }
          else {
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                      ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                    *)&a_input_id);
            IVar6 = CrossingInputEdge::input_id(&ppVar11->second);
            if (IVar6 != -3) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_e8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x165,kFatal,(ostream *)&std::cerr);
              poVar13 = S2LogMessage::stream(&local_e8);
              poVar13 = std::operator<<(poVar13,
                                        "Check failed: (next->second.input_id()) == (kSetReverseA) "
                                       );
              S2LogMessageVoidify::operator&(&local_d1,poVar13);
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_e8);
            }
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                      ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                    *)&a_input_id);
            next._M_current._5_1_ = CrossingInputEdge::left_to_right(&ppVar11->second);
          }
        }
      }
      else {
        ppVar11 = __gnu_cxx::
                  __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                  ::operator->((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                                *)&a_input_id);
        std::
        vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ::push_back((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                     *)&b_edges.
                        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar11->second);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
      ::operator++((__normal_iterator<const_std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_*,_std::vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>_>
                    *)&a_input_id);
    }
    if (local_b8->first == local_b8->second) {
      sVar8 = std::
              vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ::size((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      *)&b_edges.
                         super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      next._M_current._7_1_ = (next._M_current._7_1_ ^ (byte)sVar8) & 1;
      AddEdge(this,*local_b8,(value_type)edge0);
    }
    else {
      bVar4 = std::
              vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ::empty((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                       *)&b_edges.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar4) {
        if ((next._M_current._7_1_ & 1) != 0) {
          if ((next._M_current._5_1_ & 1) == 0) {
            __range3 = *(vector<int,_std::allocator<int>_> **)local_b8;
          }
          else {
            __range3 = (vector<int,_std::allocator<int>_> *)S2Builder::Graph::reverse(local_b8);
          }
          AddEdge(this,(Edge)__range3,(value_type)edge0);
        }
      }
      else {
        ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)ppiVar1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)ppiVar1,&local_b8->first);
        std::
        vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ::clear((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                 *)local_98);
        sVar8 = std::
                vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                ::size((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                        *)&b_edges.
                           super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ::resize((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                  *)local_98,sVar8);
        GatherIncidentEdges(this,(vector<int,_std::allocator<int>_> *)
                                 &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,
                            (vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                             *)&b_edges.
                                super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                             *)local_98);
        while( true ) {
          uVar7 = (ulong)edge0._4_4_;
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
          bVar4 = false;
          if (uVar7 < sVar8) {
            pvVar2 = this->input_ids_;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->order_,(long)edge0._4_4_);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)*pvVar9);
            bVar4 = *pvVar10 == (value_type)edge0;
          }
          if (!bVar4) break;
          pGVar3 = this->g_;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->order_,(long)edge0._4_4_);
          pEVar12 = S2Builder::Graph::edge(pGVar3,*pvVar9);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&pEVar12->second);
          ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)ppiVar1);
          GatherIncidentEdges(this,(vector<int,_std::allocator<int>_> *)ppiVar1,(int)sVar8 + -1,
                              (vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                               *)&b_edges.
                                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                               *)local_98);
          edge0._4_4_ = edge0._4_4_ + 1;
        }
        edge0._4_4_ = edge0._4_4_ + -1;
        if ((s2builder_verbose & 1U) != 0) {
          poVar13 = std::operator<<((ostream *)&std::cout,"input edge ");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,(value_type)edge0);
          poVar13 = std::operator<<(poVar13," (inside=");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,(bool)(next._M_current._7_1_ & 1));
          std::operator<<(poVar13,"):");
          ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          __end3 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)ppiVar1);
          _bi = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)ppiVar1);
          while( true ) {
            bVar4 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)&bi);
            if (!bVar4) break;
            piVar14 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end3);
            iStack_11c = *piVar14;
            poVar13 = std::operator<<((ostream *)&std::cout," ");
            std::ostream::operator<<(poVar13,iStack_11c);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3);
          }
        }
        this_00 = &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)this_00);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)this_00,sVar8);
        this_01 = &b_input_edges.
                   super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<bool,_std::allocator<bool>_>::clear
                  ((vector<bool,_std::allocator<bool>_> *)this_01);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)this_01,sVar8,false);
        a_index = 0;
        while( true ) {
          uVar7 = (ulong)a_index;
          sVar8 = std::
                  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ::size((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                          *)&b_edges.
                             super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar8 <= uVar7) break;
          pvVar15 = std::
                    vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                    ::operator[]((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                  *)&b_edges.
                                     super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)a_index);
          __range5._7_1_ = CrossingInputEdge::left_to_right(pvVar15);
          b = std::
              vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
              ::operator[]((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                            *)local_98,(long)a_index);
          __range5._0_4_ =
               GetCrossedVertexIndex
                         (this,(vector<int,_std::allocator<int>_> *)
                               &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,b,
                          (bool)(__range5._7_1_ & 1));
          if ((int)__range5 < 0) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&ai,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x1ba,kFatal,(ostream *)&std::cerr);
            poVar13 = S2LogMessage::stream((S2LogMessage *)&ai);
            std::operator<<(poVar13,"Failed to get crossed vertex index.");
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&ai);
          }
          if ((s2builder_verbose & 1U) != 0) {
            poVar13 = (ostream *)
                      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar13 = std::operator<<(poVar13,"  ");
            poVar13 = std::operator<<(poVar13,"b input edge ");
            pvVar15 = std::
                      vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      ::operator[]((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                    *)&b_edges.
                                       super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)a_index);
            IVar6 = CrossingInputEdge::input_id(pvVar15);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,IVar6);
            poVar13 = std::operator<<(poVar13," (l2r=");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,(bool)(__range5._7_1_ & 1));
            poVar13 = std::operator<<(poVar13,", crossing=");
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)(int)__range5);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pvVar9);
            std::operator<<(poVar13,")");
            __begin5 = (iterator)
                       std::
                       vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                       ::operator[]((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                     *)local_98,(long)a_index);
            __end5 = absl::
                     InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                     ::begin((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                              *)__begin5);
            x = absl::
                InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                ::end((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                       *)__begin5);
            for (; __end5 != x; __end5 = __end5 + 1) {
              e = (Edge *)__end5;
              _sign = S2Builder::Graph::edge(this->g_,__end5->id);
              poVar13 = std::operator<<((ostream *)&std::cout," (");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,_sign->first);
              poVar13 = std::operator<<(poVar13,", ");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,_sign->second);
              std::operator<<(poVar13,")");
            }
          }
          this_02 = this->input_dimensions_;
          pvVar15 = std::
                    vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                    ::operator[]((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                  *)&b_edges.
                                     super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)a_index);
          IVar6 = CrossingInputEdge::input_id(pvVar15);
          pvVar16 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              (this_02,(long)IVar6);
          local_151 = *pvVar16 == '\x01';
          if ((bool)local_151) {
            local_35c = 0;
          }
          else {
            local_35c = 1;
            if ((__range5._7_1_ & 1) == (next._M_current._6_1_ & 1)) {
              local_35c = -1;
            }
          }
          local_158 = local_35c;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,(long)(int)__range5);
          *pvVar9 = *pvVar9 + local_35c;
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &b_input_edges.
                               super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(int)__range5);
          local_168 = rVar18;
          std::_Bit_reference::operator=(&local_168,true);
          a_index = a_index + 1;
        }
        if ((s2builder_verbose & 1U) != 0) {
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        bVar5 = next._M_current._7_1_ & 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,0);
        local_17c = (uint)bVar5 + *pvVar9;
        local_180 = 1;
        while( true ) {
          uVar7 = (ulong)local_180;
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if (sVar8 <= uVar7) break;
          if (local_17c != 0) {
            rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &b_input_edges.
                                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_180)
            ;
            local_190 = rVar18;
            __x = std::_Bit_reference::operator=(&local_190,false);
            rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &b_input_edges.
                                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)(local_180 + -1));
            _i_1 = rVar18;
            std::_Bit_reference::operator=((_Bit_reference *)&i_1,__x);
          }
          if ((next._M_current._5_1_ & 1) == 0) {
            local_3ac = local_17c;
          }
          else {
            local_3ac = -local_17c;
          }
          local_1a4 = local_3ac;
          for (local_1a8 = 0; local_1a8 < (int)local_1a4; local_1a8 = local_1a8 + 1) {
            ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)(local_180 + -1))
            ;
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)local_180);
            std::pair<int,_int>::pair<int_&,_int_&,_true>(&stack0xfffffffffffffe50,pvVar9,pvVar17);
            AddEdge(this,EStack_1b0,(value_type)edge0);
          }
          for (local_1b4 = local_1a4; (int)local_1b4 < 0; local_1b4 = local_1b4 + 1) {
            ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)local_180);
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)(local_180 + -1)
                                );
            std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_1bc,pvVar9,pvVar17);
            AddEdge(this,local_1bc,(value_type)edge0);
          }
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &a_isolated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,(long)local_180);
          local_17c = *pvVar9 + local_17c;
          local_180 = local_180 + 1;
        }
        local_1d1 = 0;
        local_3d1 = 1 < local_17c;
        if (local_3d1) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&ai_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                     ,0x1d6,kFatal,(ostream *)&std::cerr);
          local_1d1 = 1;
          poVar13 = S2LogMessage::stream((S2LogMessage *)&ai_1);
          poVar13 = std::operator<<(poVar13,"Check failed: multiplicity == 0 || multiplicity == 1 ")
          ;
          S2LogMessageVoidify::operator&(&local_1bd,poVar13);
        }
        if ((local_1d1 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&ai_1);
        }
        next._M_current._7_1_ = local_17c != 0;
        pvVar16 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            (this->input_dimensions_,(long)(value_type)edge0);
        if (*pvVar16 != '\0') {
          local_1d8 = 0;
          while( true ) {
            uVar7 = (ulong)local_1d8;
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)
                               &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (sVar8 <= uVar7) break;
            rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &b_input_edges.
                                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1d8)
            ;
            local_1e8 = rVar18;
            bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_1e8);
            if (bVar4) {
              ppiVar1 = &a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)local_1d8);
              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)ppiVar1,(long)local_1d8);
              std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_1f0,pvVar9,pvVar17);
              AddEdge(this,local_1f0,(value_type)edge0);
            }
            local_1d8 = local_1d8 + 1;
          }
        }
      }
    }
    edge0._4_4_ = edge0._4_4_ + 1;
  } while( true );
}

Assistant:

void GraphEdgeClipper::Run() {
  // Declare vectors here and reuse them to avoid reallocation.
  vector<VertexId> a_vertices;
  vector<int> a_num_crossings;
  vector<bool> a_isolated;
  vector<CrossingInputEdge> b_input_edges;
  vector<CrossingGraphEdgeVector> b_edges;

  bool inside = false;
  bool invert_b = false;
  bool reverse_a = false;
  auto next = input_crossings_.begin();
  for (int i = 0; i < order_.size(); ++i) {
    // For each input edge (the "A" input edge), gather all the input edges
    // that cross it (the "B" input edges).
    InputEdgeId a_input_id = input_ids_[order_[i]];
    const Graph::Edge& edge0 = g_.edge(order_[i]);
    b_input_edges.clear();
    for (; next != input_crossings_.end(); ++next) {
      if (next->first != a_input_id) break;
      if (next->second.input_id() >= 0) {
        b_input_edges.push_back(next->second);
      } else if (next->second.input_id() == kSetInside) {
        inside = next->second.left_to_right();
      } else if (next->second.input_id() == kSetInvertB) {
        invert_b = next->second.left_to_right();
      } else {
        S2_DCHECK_EQ(next->second.input_id(), kSetReverseA);
        reverse_a = next->second.left_to_right();
      }
    }
    // Optimization for degenerate edges.
    // TODO(ericv): If the output layer for this edge dimension specifies
    // DegenerateEdges::DISCARD, then remove the edge here.
    if (edge0.first == edge0.second) {
      inside ^= (b_input_edges.size() & 1);
      AddEdge(edge0, a_input_id);
      continue;
    }
    // Optimization for the case where there are no crossings.
    if (b_input_edges.empty()) {
      // In general the caller only passes edges that are part of the output
      // (i.e., we could S2_DCHECK(inside) here).  The one exception is for
      // polyline/polygon operations, where the polygon edges are needed to
      // compute the polyline output but are not emitted themselves.
      if (inside) {
        AddEdge(reverse_a ? Graph::reverse(edge0) : edge0, a_input_id);
      }
      continue;
    }
    // Walk along the chain of snapped edges for input edge A, and at each
    // vertex collect all the incident edges that belong to one of the
    // crossing edge chains (the "B" input edges).
    a_vertices.clear();
    a_vertices.push_back(edge0.first);
    b_edges.clear();
    b_edges.resize(b_input_edges.size());
    GatherIncidentEdges(a_vertices, 0, b_input_edges, &b_edges);
    for (; i < order_.size() && input_ids_[order_[i]] == a_input_id; ++i) {
      a_vertices.push_back(g_.edge(order_[i]).second);
      GatherIncidentEdges(a_vertices, a_vertices.size() - 1, b_input_edges,
                          &b_edges);
    }
    --i;
    if (s2builder_verbose) {
      std::cout << "input edge " << a_input_id << " (inside=" << inside << "):";
      for (VertexId id : a_vertices) std::cout << " " << id;
    }
    // Now for each B edge chain, decide which vertex of the A chain it
    // crosses, and keep track of the number of signed crossings at each A
    // vertex.  The sign of a crossing depends on whether the other edge
    // crosses from left to right or right to left.
    //
    // This would not be necessary if all calculations were done in exact
    // arithmetic, because crossings would have strictly alternating signs.
    // But because we have already snapped the result, some crossing locations
    // are ambiguous, and GetCrossedVertexIndex() handles this by choosing a
    // candidate vertex arbitrarily.  The end result is that rarely, we may
    // see two crossings in a row with the same sign.  We correct for this by
    // adding extra output edges that essentially link up the crossings in the
    // correct (alternating sign) order.  Compared to the "correct" behavior,
    // the only difference is that we have added some extra sibling pairs
    // (consisting of an edge and its corresponding reverse edge) which do not
    // affect the result.
    a_num_crossings.clear();
    a_num_crossings.resize(a_vertices.size());
    a_isolated.clear();
    a_isolated.resize(a_vertices.size());
    for (int bi = 0; bi < b_input_edges.size(); ++bi) {
      bool left_to_right = b_input_edges[bi].left_to_right();
      int a_index = GetCrossedVertexIndex(a_vertices, b_edges[bi],
                                          left_to_right);
      if (a_index >= 0) {
        if (s2builder_verbose) {
          std::cout << std::endl << "  " << "b input edge "
                    << b_input_edges[bi].input_id() << " (l2r=" << left_to_right
                    << ", crossing=" << a_vertices[a_index] << ")";
          for (const auto& x : b_edges[bi]) {
            const Graph::Edge& e = g_.edge(x.id);
            std::cout << " (" << e.first << ", " << e.second << ")";
          }
        }
        // Keep track of the number of signed crossings (see above).
        bool is_line = input_dimensions_[b_input_edges[bi].input_id()] == 1;
        int sign = is_line ? 0 : (left_to_right == invert_b) ? -1 : 1;
        a_num_crossings[a_index] += sign;

        // Any polyline or polygon vertex that has at least one crossing but no
        // adjacent emitted edge may be emitted as an isolated vertex.
        a_isolated[a_index] = true;
      } else {
        // TODO(b/112043775): fix this condition.
        S2_LOG(DFATAL) << "Failed to get crossed vertex index.";
      }
    }
    if (s2builder_verbose) std::cout << std::endl;

    // Finally, we iterate through the A edge chain, keeping track of the
    // number of signed crossings as we go along.  The "multiplicity" is
    // defined as the cumulative number of signed crossings, and indicates how
    // many edges should be output (and in which direction) in order to link
    // up the edge crossings in the correct order.  (The multiplicity is
    // almost always either 0 or 1 except in very rare cases.)
    int multiplicity = inside + a_num_crossings[0];
    for (int ai = 1; ai < a_vertices.size(); ++ai) {
      if (multiplicity != 0) {
        a_isolated[ai - 1] = a_isolated[ai] = false;
      }
      int edge_count = reverse_a ? -multiplicity : multiplicity;
      // Output any forward edges required.
      for (int i = 0; i < edge_count; ++i) {
        AddEdge(Graph::Edge(a_vertices[ai - 1], a_vertices[ai]), a_input_id);
      }
      // Output any reverse edges required.
      for (int i = edge_count; i < 0; ++i) {
        AddEdge(Graph::Edge(a_vertices[ai], a_vertices[ai - 1]), a_input_id);
      }
      multiplicity += a_num_crossings[ai];
    }
    // Multiplicities other than 0 or 1 can only occur in the edge interior.
    S2_DCHECK(multiplicity == 0 || multiplicity == 1);
    inside = (multiplicity != 0);

    // Output any isolated polyline vertices.
    // TODO(ericv): Only do this if an output layer wants degenerate edges.
    if (input_dimensions_[a_input_id] != 0) {
      for (int ai = 0; ai < a_vertices.size(); ++ai) {
        if (a_isolated[ai]) {
          AddEdge(Graph::Edge(a_vertices[ai], a_vertices[ai]), a_input_id);
        }
      }
    }
  }
}